

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O2

uint __thiscall antlr::TokenBuffer::mark(TokenBuffer *this)

{
  syncConsume(this);
  this->nMarkers = this->nMarkers + 1;
  return this->markerOffset;
}

Assistant:

unsigned int TokenBuffer::mark()
{
	syncConsume();
	nMarkers++;
	return markerOffset;
}